

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx2::ConeCurveMiIntersectorK<8,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Scene *pSVar12;
  Geometry *pGVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar38 [32];
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  int iVar81;
  byte bVar82;
  ulong uVar83;
  bool bVar84;
  ulong uVar85;
  undefined4 uVar86;
  float fVar87;
  undefined1 auVar88 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar89 [32];
  float fVar96;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar107;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar119;
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar131;
  float fVar136;
  float fVar138;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar137;
  float fVar139;
  float fVar141;
  undefined1 auVar135 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar153;
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar154;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  float fVar172;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar182;
  float fVar183;
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar184 [64];
  float fVar185;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  RTCFilterFunctionNArguments local_6d8;
  Primitive *local_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [16];
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  uint local_2e0 [4];
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  RTCHitN local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  
  pSVar12 = context->scene;
  local_2e0[0] = line->sharedGeomID;
  uVar4 = (line->v0).field_0.i[0];
  pGVar13 = (pSVar12->geometries).items[local_2e0[0]].ptr;
  lVar14 = *(long *)&pGVar13[1].time_range.upper;
  p_Var15 = pGVar13[1].intersectionFilterN;
  uVar5 = (line->v0).field_0.i[1];
  uVar6 = (line->v0).field_0.i[2];
  uVar7 = (line->v0).field_0.i[4];
  auVar88 = *(undefined1 (*) [16])(lVar14 + (ulong)uVar7 * (long)p_Var15);
  auVar89._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)uVar4 * (long)p_Var15);
  auVar89._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  uVar8 = (line->v0).field_0.i[3];
  uVar9 = (line->v0).field_0.i[5];
  auVar88 = *(undefined1 (*) [16])(lVar14 + (ulong)uVar9 * (long)p_Var15);
  auVar100._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)uVar5 * (long)p_Var15);
  auVar100._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  uVar10 = (line->v0).field_0.i[6];
  auVar88 = *(undefined1 (*) [16])(lVar14 + (ulong)uVar10 * (long)p_Var15);
  auVar108._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)uVar6 * (long)p_Var15);
  auVar108._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  uVar11 = (line->v0).field_0.i[7];
  auVar88 = *(undefined1 (*) [16])(lVar14 + (ulong)uVar11 * (long)p_Var15);
  auVar106._0_16_ =
       ZEXT116(0) * auVar88 +
       ZEXT116(1) * *(undefined1 (*) [16])(lVar14 + (ulong)uVar8 * (long)p_Var15);
  auVar106._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar88;
  auVar164._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar7 + 1) * (long)p_Var15);
  auVar164._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar4 + 1) * (long)p_Var15);
  auVar132._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar9 + 1) * (long)p_Var15);
  auVar132._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar5 + 1) * (long)p_Var15);
  auVar145._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar10 + 1) * (long)p_Var15);
  auVar145._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar6 + 1) * (long)p_Var15);
  auVar155._16_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar11 + 1) * (long)p_Var15);
  auVar155._0_16_ = *(undefined1 (*) [16])(lVar14 + (ulong)(uVar8 + 1) * (long)p_Var15);
  auVar178 = vpunpckldq_avx2(auVar89,auVar108);
  auVar129 = vpunpckhdq_avx2(auVar89,auVar108);
  auVar170 = vpunpckldq_avx2(auVar100,auVar106);
  auVar123 = vpunpckhdq_avx2(auVar100,auVar106);
  auVar127 = vpunpckldq_avx2(auVar178,auVar170);
  auVar195 = vpunpckhdq_avx2(auVar178,auVar170);
  auVar38 = vpunpckldq_avx2(auVar129,auVar123);
  auVar109 = vpunpckhdq_avx2(auVar129,auVar123);
  auVar129 = vunpcklps_avx(auVar164,auVar145);
  auVar123 = vunpckhps_avx(auVar164,auVar145);
  auVar89 = vunpcklps_avx(auVar132,auVar155);
  auVar170 = vunpckhps_avx(auVar132,auVar155);
  auVar100 = vunpcklps_avx(auVar129,auVar89);
  uVar2 = line->leftExists;
  uVar3 = line->rightExists;
  auVar178 = vpcmpeqd_avx2(auVar178,auVar178);
  auVar106 = vpcmpeqd_avx2(auVar178,(undefined1  [32])(line->primIDs).field_0);
  local_2e0[1] = local_2e0[0];
  local_2e0[2] = local_2e0[0];
  local_2e0[3] = local_2e0[0];
  uStack_2d0 = local_2e0[0];
  uStack_2cc = local_2e0[0];
  uStack_2c8 = local_2e0[0];
  uStack_2c4 = local_2e0[0];
  fVar153 = *(float *)(ray + k * 4 + 0x80);
  local_340._4_4_ = fVar153;
  local_340._0_4_ = fVar153;
  fStack_338 = fVar153;
  fStack_334 = fVar153;
  fStack_330 = fVar153;
  fStack_32c = fVar153;
  fStack_328 = fVar153;
  register0x000012dc = fVar153;
  fVar185 = *(float *)(ray + k * 4 + 0xa0);
  local_300._4_4_ = fVar185;
  local_300._0_4_ = fVar185;
  fStack_2f8 = fVar185;
  fStack_2f4 = fVar185;
  fStack_2f0 = fVar185;
  fStack_2ec = fVar185;
  fStack_2e8 = fVar185;
  register0x000015dc = fVar185;
  local_420 = *(float *)(ray + k * 4 + 0xc0);
  auVar89 = vunpckhps_avx(auVar129,auVar89);
  auVar88 = vfmadd231ps_fma(ZEXT432((uint)(local_420 * local_420)),_local_300,_local_300);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),_local_340,_local_340);
  uVar86 = auVar88._0_4_;
  auVar146._4_4_ = uVar86;
  auVar146._0_4_ = uVar86;
  auVar146._8_4_ = uVar86;
  auVar146._12_4_ = uVar86;
  auVar146._16_4_ = uVar86;
  auVar146._20_4_ = uVar86;
  auVar146._24_4_ = uVar86;
  auVar146._28_4_ = uVar86;
  auVar129 = vrcpps_avx(auVar146);
  auVar108 = vunpcklps_avx(auVar123,auVar170);
  auVar178 = vunpckhps_avx(auVar123,auVar170);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar101._16_4_ = 0x3f800000;
  auVar101._20_4_ = 0x3f800000;
  auVar101._24_4_ = 0x3f800000;
  auVar101._28_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar146,auVar129,auVar101);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar129,auVar129);
  auVar170._4_4_ = (auVar127._4_4_ + auVar100._4_4_) * 0.5;
  auVar170._0_4_ = (auVar127._0_4_ + auVar100._0_4_) * 0.5;
  auVar170._8_4_ = (auVar127._8_4_ + auVar100._8_4_) * 0.5;
  auVar170._12_4_ = (auVar127._12_4_ + auVar100._12_4_) * 0.5;
  auVar170._16_4_ = (auVar127._16_4_ + auVar100._16_4_) * 0.5;
  auVar170._20_4_ = (auVar127._20_4_ + auVar100._20_4_) * 0.5;
  auVar170._24_4_ = (auVar127._24_4_ + auVar100._24_4_) * 0.5;
  auVar170._28_4_ = auVar127._28_4_ + auVar100._28_4_;
  auVar129._4_4_ = (auVar89._4_4_ + auVar195._4_4_) * 0.5;
  auVar129._0_4_ = (auVar89._0_4_ + auVar195._0_4_) * 0.5;
  auVar129._8_4_ = (auVar89._8_4_ + auVar195._8_4_) * 0.5;
  auVar129._12_4_ = (auVar89._12_4_ + auVar195._12_4_) * 0.5;
  auVar129._16_4_ = (auVar89._16_4_ + auVar195._16_4_) * 0.5;
  auVar129._20_4_ = (auVar89._20_4_ + auVar195._20_4_) * 0.5;
  auVar129._24_4_ = (auVar89._24_4_ + auVar195._24_4_) * 0.5;
  auVar129._28_4_ = auVar89._28_4_ + auVar195._28_4_;
  auVar123._4_4_ = (auVar38._4_4_ + auVar108._4_4_) * 0.5;
  auVar123._0_4_ = (auVar38._0_4_ + auVar108._0_4_) * 0.5;
  auVar123._8_4_ = (auVar38._8_4_ + auVar108._8_4_) * 0.5;
  auVar123._12_4_ = (auVar38._12_4_ + auVar108._12_4_) * 0.5;
  auVar123._16_4_ = (auVar38._16_4_ + auVar108._16_4_) * 0.5;
  auVar123._20_4_ = (auVar38._20_4_ + auVar108._20_4_) * 0.5;
  auVar123._24_4_ = (auVar38._24_4_ + auVar108._24_4_) * 0.5;
  auVar123._28_4_ = 0x3f000000;
  fVar189 = *(float *)(ray + k * 4 + 0x20);
  auVar169._4_4_ = fVar189;
  auVar169._0_4_ = fVar189;
  auVar169._8_4_ = fVar189;
  auVar169._12_4_ = fVar189;
  auVar169._16_4_ = fVar189;
  auVar169._20_4_ = fVar189;
  auVar169._24_4_ = fVar189;
  auVar169._28_4_ = fVar189;
  auVar129 = vsubps_avx(auVar129,auVar169);
  fVar190 = *(float *)(ray + k * 4 + 0x40);
  auVar173._4_4_ = fVar190;
  auVar173._0_4_ = fVar190;
  auVar173._8_4_ = fVar190;
  auVar173._12_4_ = fVar190;
  auVar173._16_4_ = fVar190;
  auVar173._20_4_ = fVar190;
  auVar173._24_4_ = fVar190;
  auVar173._28_4_ = fVar190;
  auVar123 = vsubps_avx(auVar123,auVar173);
  auVar44._4_4_ = local_420 * auVar123._4_4_;
  auVar44._0_4_ = local_420 * auVar123._0_4_;
  auVar44._8_4_ = local_420 * auVar123._8_4_;
  auVar44._12_4_ = local_420 * auVar123._12_4_;
  auVar44._16_4_ = local_420 * auVar123._16_4_;
  auVar44._20_4_ = local_420 * auVar123._20_4_;
  auVar44._24_4_ = local_420 * auVar123._24_4_;
  auVar44._28_4_ = auVar123._28_4_;
  auVar41 = vfmadd231ps_fma(auVar44,_local_300,auVar129);
  fVar191 = *(float *)(ray + k * 4);
  auVar165._4_4_ = fVar191;
  auVar165._0_4_ = fVar191;
  auVar165._8_4_ = fVar191;
  auVar165._12_4_ = fVar191;
  auVar165._16_4_ = fVar191;
  auVar165._20_4_ = fVar191;
  auVar165._24_4_ = fVar191;
  auVar165._28_4_ = fVar191;
  auVar129 = vsubps_avx(auVar170,auVar165);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),_local_340,auVar129);
  fVar130 = auVar41._0_4_ * auVar88._0_4_;
  fVar136 = auVar41._4_4_ * auVar88._4_4_;
  fVar138 = auVar41._8_4_ * auVar88._8_4_;
  fVar140 = auVar41._12_4_ * auVar88._12_4_;
  fVar45 = auVar129._28_4_;
  auVar166._0_4_ = fVar191 + fVar153 * fVar130;
  auVar166._4_4_ = fVar191 + fVar153 * fVar136;
  auVar166._8_4_ = fVar191 + fVar153 * fVar138;
  auVar166._12_4_ = fVar191 + fVar153 * fVar140;
  auVar166._16_4_ = fVar191 + fVar153 * 0.0;
  auVar166._20_4_ = fVar191 + fVar153 * 0.0;
  auVar166._24_4_ = fVar191 + fVar153 * 0.0;
  auVar166._28_4_ = fVar191 + 0.0;
  auVar147._0_4_ = fVar189 + fVar185 * fVar130;
  auVar147._4_4_ = fVar189 + fVar185 * fVar136;
  auVar147._8_4_ = fVar189 + fVar185 * fVar138;
  auVar147._12_4_ = fVar189 + fVar185 * fVar140;
  auVar147._16_4_ = fVar189 + fVar185 * 0.0;
  auVar147._20_4_ = fVar189 + fVar185 * 0.0;
  auVar147._24_4_ = fVar189 + fVar185 * 0.0;
  auVar147._28_4_ = fVar189 + 0.0;
  auVar133._0_4_ = fVar190 + local_420 * fVar130;
  auVar133._4_4_ = fVar190 + local_420 * fVar136;
  auVar133._8_4_ = fVar190 + local_420 * fVar138;
  auVar133._12_4_ = fVar190 + local_420 * fVar140;
  auVar133._16_4_ = fVar190 + local_420 * 0.0;
  auVar133._20_4_ = fVar190 + local_420 * 0.0;
  auVar133._24_4_ = fVar190 + local_420 * 0.0;
  auVar133._28_4_ = fVar190 + 0.0;
  local_4e0 = vsubps_avx(auVar100,auVar127);
  _local_560 = vsubps_avx(auVar166,auVar127);
  local_500 = vsubps_avx(auVar89,auVar195);
  _local_580 = vsubps_avx(auVar147,auVar195);
  local_520 = vsubps_avx(auVar108,auVar38);
  local_4c0 = vsubps_avx(auVar133,auVar38);
  fVar193 = local_520._0_4_;
  fVar18 = local_520._4_4_;
  auVar195._4_4_ = fVar18 * fVar18;
  auVar195._0_4_ = fVar193 * fVar193;
  fVar22 = local_520._8_4_;
  auVar195._8_4_ = fVar22 * fVar22;
  fVar26 = local_520._12_4_;
  auVar195._12_4_ = fVar26 * fVar26;
  fVar30 = local_520._16_4_;
  auVar195._16_4_ = fVar30 * fVar30;
  fVar33 = local_520._20_4_;
  auVar195._20_4_ = fVar33 * fVar33;
  fVar36 = local_520._24_4_;
  auVar195._24_4_ = fVar36 * fVar36;
  auVar195._28_4_ = auVar127._28_4_;
  auVar88 = vfmadd231ps_fma(auVar195,local_500,local_500);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),local_4e0,local_4e0);
  fVar194 = local_4c0._0_4_;
  fVar19 = local_4c0._4_4_;
  auVar127._4_4_ = fVar18 * fVar19;
  auVar127._0_4_ = fVar193 * fVar194;
  fVar23 = local_4c0._8_4_;
  auVar127._8_4_ = fVar22 * fVar23;
  fVar27 = local_4c0._12_4_;
  auVar127._12_4_ = fVar26 * fVar27;
  fVar31 = local_4c0._16_4_;
  auVar127._16_4_ = fVar30 * fVar31;
  fVar34 = local_4c0._20_4_;
  auVar127._20_4_ = fVar33 * fVar34;
  fVar37 = local_4c0._24_4_;
  auVar127._24_4_ = fVar36 * fVar37;
  auVar127._28_4_ = auVar38._28_4_;
  auVar41 = vfmadd231ps_fma(auVar127,_local_580,local_500);
  auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),_local_560,local_4e0);
  auVar38._4_4_ = local_420 * fVar18;
  auVar38._0_4_ = local_420 * fVar193;
  auVar38._8_4_ = local_420 * fVar22;
  auVar38._12_4_ = local_420 * fVar26;
  auVar38._16_4_ = local_420 * fVar30;
  auVar38._20_4_ = local_420 * fVar33;
  auVar38._24_4_ = local_420 * fVar36;
  auVar38._28_4_ = fVar190;
  auVar42 = vfmadd231ps_fma(auVar38,_local_300,local_500);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),_local_340,local_4e0);
  auVar129 = vsubps_avx(auVar109,auVar178);
  fVar16 = auVar129._0_4_;
  fVar20 = auVar129._4_4_;
  fVar24 = auVar129._8_4_;
  fVar28 = auVar129._12_4_;
  fVar32 = auVar129._16_4_;
  fVar35 = auVar129._20_4_;
  fVar182 = auVar129._24_4_;
  fVar46 = local_4e0._28_4_;
  fVar189 = auVar88._0_4_;
  fVar87 = fVar16 * fVar16 + fVar189;
  fVar190 = auVar88._4_4_;
  fVar94 = fVar20 * fVar20 + fVar190;
  fVar191 = auVar88._8_4_;
  fVar95 = fVar24 * fVar24 + fVar191;
  fVar192 = auVar88._12_4_;
  fVar96 = fVar28 * fVar28 + fVar192;
  fVar97 = fVar32 * fVar32 + 0.0;
  fVar98 = fVar35 * fVar35 + 0.0;
  fVar99 = fVar182 * fVar182 + 0.0;
  auVar47._4_4_ = local_420 * fVar19;
  auVar47._0_4_ = local_420 * fVar194;
  auVar47._8_4_ = local_420 * fVar23;
  auVar47._12_4_ = local_420 * fVar27;
  auVar47._16_4_ = local_420 * fVar31;
  auVar47._20_4_ = local_420 * fVar34;
  auVar47._24_4_ = local_420 * fVar37;
  auVar47._28_4_ = fVar46;
  auVar43 = vfmadd231ps_fma(auVar47,_local_300,_local_580);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),_local_340,_local_560);
  fVar119 = fVar189 * fVar189;
  fVar124 = fVar190 * fVar190;
  fVar125 = fVar191 * fVar191;
  fVar126 = fVar192 * fVar192;
  uStack_304 = fVar153;
  _local_320 = ZEXT1628(CONCAT412(fVar126,CONCAT48(fVar125,CONCAT44(fVar124,fVar119))));
  fVar17 = auVar41._0_4_;
  fVar172 = auVar42._0_4_;
  fVar21 = auVar41._4_4_;
  fVar175 = auVar42._4_4_;
  fVar25 = auVar41._8_4_;
  fVar176 = auVar42._8_4_;
  fVar29 = auVar41._12_4_;
  fVar177 = auVar42._12_4_;
  fVar48 = local_520._28_4_;
  auVar49._4_4_ = fVar94 * fVar175 * fVar21;
  auVar49._0_4_ = fVar87 * fVar172 * fVar17;
  auVar49._8_4_ = fVar95 * fVar176 * fVar25;
  auVar49._12_4_ = fVar96 * fVar177 * fVar29;
  auVar49._16_4_ = fVar97 * 0.0;
  auVar49._20_4_ = fVar98 * 0.0;
  auVar49._24_4_ = fVar99 * 0.0;
  auVar49._28_4_ = fVar48;
  auVar123 = vsubps_avx(ZEXT1632(CONCAT412(fVar126 * auVar43._12_4_,
                                           CONCAT48(fVar125 * auVar43._8_4_,
                                                    CONCAT44(fVar124 * auVar43._4_4_,
                                                             fVar119 * auVar43._0_4_)))),auVar49);
  auVar127 = ZEXT1632(auVar88);
  fVar131 = auVar109._0_4_;
  fVar107 = fVar131 * fVar189;
  fVar137 = auVar109._4_4_;
  fVar113 = fVar137 * fVar190;
  auVar50._4_4_ = fVar113;
  auVar50._0_4_ = fVar107;
  fVar139 = auVar109._8_4_;
  fVar114 = fVar139 * fVar191;
  auVar50._8_4_ = fVar114;
  fVar141 = auVar109._12_4_;
  fVar115 = fVar141 * fVar192;
  auVar50._12_4_ = fVar115;
  fVar142 = auVar109._16_4_;
  fVar116 = fVar142 * 0.0;
  auVar50._16_4_ = fVar116;
  fVar143 = auVar109._20_4_;
  fVar117 = fVar143 * 0.0;
  auVar50._20_4_ = fVar117;
  fVar144 = auVar109._24_4_;
  fVar118 = fVar144 * 0.0;
  auVar50._24_4_ = fVar118;
  auVar50._28_4_ = fVar48;
  fVar183 = auVar109._28_4_;
  auVar102._0_4_ = fVar16 * fVar172 * fVar107 + auVar123._0_4_;
  auVar102._4_4_ = fVar20 * fVar175 * fVar113 + auVar123._4_4_;
  auVar102._8_4_ = fVar24 * fVar176 * fVar114 + auVar123._8_4_;
  auVar102._12_4_ = fVar28 * fVar177 * fVar115 + auVar123._12_4_;
  auVar102._16_4_ = fVar32 * 0.0 * fVar116 + auVar123._16_4_;
  auVar102._20_4_ = fVar35 * 0.0 * fVar117 + auVar123._20_4_;
  auVar102._24_4_ = fVar182 * 0.0 * fVar118 + auVar123._24_4_;
  auVar102._28_4_ = fVar183 + auVar123._28_4_;
  auVar109._4_4_ = fVar19 * fVar19;
  auVar109._0_4_ = fVar194 * fVar194;
  auVar109._8_4_ = fVar23 * fVar23;
  auVar109._12_4_ = fVar27 * fVar27;
  auVar109._16_4_ = fVar31 * fVar31;
  auVar109._20_4_ = fVar34 * fVar34;
  auVar109._24_4_ = fVar37 * fVar37;
  auVar109._28_4_ = fVar183;
  auVar88 = vfmadd231ps_fma(auVar109,_local_580,_local_580);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),_local_560,_local_560);
  auVar51._4_4_ = fVar21 * fVar21 * fVar94;
  auVar51._0_4_ = fVar17 * fVar17 * fVar87;
  auVar51._8_4_ = fVar25 * fVar25 * fVar95;
  auVar51._12_4_ = fVar29 * fVar29 * fVar96;
  auVar51._16_4_ = fVar97 * 0.0;
  auVar51._20_4_ = fVar98 * 0.0;
  auVar51._24_4_ = fVar99 * 0.0;
  auVar51._28_4_ = local_560._28_4_;
  auVar123 = vsubps_avx(ZEXT1632(CONCAT412(auVar88._12_4_ * fVar126,
                                           CONCAT48(auVar88._8_4_ * fVar125,
                                                    CONCAT44(auVar88._4_4_ * fVar124,
                                                             auVar88._0_4_ * fVar119)))),auVar51);
  auVar52._4_4_ = (fVar20 + fVar20) * fVar21;
  auVar52._0_4_ = (fVar16 + fVar16) * fVar17;
  auVar52._8_4_ = (fVar24 + fVar24) * fVar25;
  auVar52._12_4_ = (fVar28 + fVar28) * fVar29;
  auVar52._16_4_ = (fVar32 + fVar32) * 0.0;
  auVar52._20_4_ = (fVar35 + fVar35) * 0.0;
  auVar52._24_4_ = (fVar182 + fVar182) * 0.0;
  auVar52._28_4_ = auVar129._28_4_ + auVar129._28_4_;
  auVar129 = vsubps_avx(auVar52,auVar50);
  fVar154 = fVar172 * fVar172;
  fVar161 = fVar175 * fVar175;
  fVar162 = fVar176 * fVar176;
  fVar163 = fVar177 * fVar177;
  fStack_464 = local_4c0._28_4_;
  auVar53._4_4_ = fVar94 * fVar161;
  auVar53._0_4_ = fVar87 * fVar154;
  auVar53._8_4_ = fVar95 * fVar162;
  auVar53._12_4_ = fVar96 * fVar163;
  auVar53._16_4_ = fVar97 * 0.0;
  auVar53._20_4_ = fVar98 * 0.0;
  auVar53._24_4_ = fVar99 * 0.0;
  auVar53._28_4_ = auVar123._28_4_;
  auVar170 = vsubps_avx(_local_320,auVar53);
  auVar54._4_4_ = auVar170._4_4_ * (auVar123._4_4_ + auVar129._4_4_ * fVar113);
  auVar54._0_4_ = auVar170._0_4_ * (auVar123._0_4_ + auVar129._0_4_ * fVar107);
  auVar54._8_4_ = auVar170._8_4_ * (auVar123._8_4_ + auVar129._8_4_ * fVar114);
  auVar54._12_4_ = auVar170._12_4_ * (auVar123._12_4_ + auVar129._12_4_ * fVar115);
  auVar54._16_4_ = auVar170._16_4_ * (auVar123._16_4_ + auVar129._16_4_ * fVar116);
  auVar54._20_4_ = auVar170._20_4_ * (auVar123._20_4_ + auVar129._20_4_ * fVar117);
  auVar54._24_4_ = auVar170._24_4_ * (auVar123._24_4_ + auVar129._24_4_ * fVar118);
  auVar54._28_4_ = auVar123._28_4_ + fVar48;
  auVar55._4_4_ = auVar102._4_4_ * auVar102._4_4_;
  auVar55._0_4_ = auVar102._0_4_ * auVar102._0_4_;
  auVar55._8_4_ = auVar102._8_4_ * auVar102._8_4_;
  auVar55._12_4_ = auVar102._12_4_ * auVar102._12_4_;
  auVar55._16_4_ = auVar102._16_4_ * auVar102._16_4_;
  auVar55._20_4_ = auVar102._20_4_ * auVar102._20_4_;
  auVar55._24_4_ = auVar102._24_4_ * auVar102._24_4_;
  auVar55._28_4_ = auVar129._28_4_;
  auVar123 = vsubps_avx(auVar55,auVar54);
  auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
  auVar129 = vcmpps_avx(auVar123,auVar109,5);
  auVar195 = auVar129 & ~auVar106;
  if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar195 >> 0x7f,0) != '\0') ||
        (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar195 >> 0xbf,0) != '\0') ||
      (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar195[0x1f] < '\0')
  {
    auVar129 = vandnps_avx(auVar106,auVar129);
    auVar88 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar100 = vsubps_avx(auVar166,auVar100);
    auVar195 = vsubps_avx(auVar147,auVar89);
    auVar108 = vsubps_avx(auVar133,auVar108);
    auVar120._2_2_ = 0;
    auVar120._0_2_ = uVar3;
    auVar123 = vsqrtps_avx(auVar123);
    auVar120._4_2_ = uVar3;
    auVar120._6_2_ = 0;
    auVar120._8_2_ = uVar3;
    auVar120._10_2_ = 0;
    auVar120._12_2_ = uVar3;
    auVar120._14_2_ = 0;
    auVar120._16_2_ = uVar3;
    auVar120._18_2_ = 0;
    auVar120._20_2_ = uVar3;
    auVar120._22_2_ = 0;
    auVar120._24_2_ = uVar3;
    auVar120._26_2_ = 0;
    auVar120._28_2_ = uVar3;
    auVar120._30_2_ = 0;
    uStack_470 = 0;
    uStack_46c = 0;
    uStack_468 = 0;
    auVar129 = vrcpps_avx(auVar170);
    auVar90._8_4_ = 0x3f800000;
    auVar90._0_8_ = 0x3f8000003f800000;
    auVar90._12_4_ = 0x3f800000;
    auVar90._16_4_ = 0x3f800000;
    auVar90._20_4_ = 0x3f800000;
    auVar90._24_4_ = 0x3f800000;
    auVar90._28_4_ = 0x3f800000;
    auVar41 = vfnmadd213ps_fma(auVar129,auVar170,auVar90);
    auVar186._8_4_ = 0x7fffffff;
    auVar186._0_8_ = 0x7fffffff7fffffff;
    auVar186._12_4_ = 0x7fffffff;
    auVar186._16_4_ = 0x7fffffff;
    auVar186._20_4_ = 0x7fffffff;
    auVar186._24_4_ = 0x7fffffff;
    auVar186._28_4_ = 0x7fffffff;
    auVar41 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar129,auVar129);
    auVar129 = vandps_avx(auVar170,auVar186);
    auVar167._8_4_ = 0x219392ef;
    auVar167._0_8_ = 0x219392ef219392ef;
    auVar167._12_4_ = 0x219392ef;
    auVar167._16_4_ = 0x219392ef;
    auVar167._20_4_ = 0x219392ef;
    auVar167._24_4_ = 0x219392ef;
    auVar167._28_4_ = 0x219392ef;
    auVar129 = vcmpps_avx(auVar129,auVar167,2);
    uVar85 = CONCAT44(auVar102._4_4_,auVar102._0_4_);
    auVar156._0_8_ = uVar85 ^ 0x8000000080000000;
    auVar156._8_4_ = -auVar102._8_4_;
    auVar156._12_4_ = -auVar102._12_4_;
    auVar156._16_4_ = -auVar102._16_4_;
    auVar156._20_4_ = -auVar102._20_4_;
    auVar156._24_4_ = -auVar102._24_4_;
    auVar156._28_4_ = -auVar102._28_4_;
    auVar170 = vsubps_avx(auVar156,auVar123);
    auVar89 = vsubps_avx(auVar123,auVar102);
    auVar148._8_4_ = 0xff800000;
    auVar148._0_8_ = 0xff800000ff800000;
    auVar148._12_4_ = 0xff800000;
    auVar148._16_4_ = 0xff800000;
    auVar148._20_4_ = 0xff800000;
    auVar148._24_4_ = 0xff800000;
    auVar148._28_4_ = 0xff800000;
    auVar56._4_4_ = auVar41._4_4_ * auVar170._4_4_;
    auVar56._0_4_ = auVar41._0_4_ * auVar170._0_4_;
    auVar56._8_4_ = auVar41._8_4_ * auVar170._8_4_;
    auVar56._12_4_ = auVar41._12_4_ * auVar170._12_4_;
    auVar56._16_4_ = auVar170._16_4_ * 0.0;
    auVar56._20_4_ = auVar170._20_4_ * 0.0;
    auVar56._24_4_ = auVar170._24_4_ * 0.0;
    auVar56._28_4_ = auVar123._28_4_;
    auVar123 = vblendvps_avx(auVar56,auVar148,auVar129);
    auVar57._4_4_ = auVar41._4_4_ * auVar89._4_4_;
    auVar57._0_4_ = auVar41._0_4_ * auVar89._0_4_;
    auVar57._8_4_ = auVar41._8_4_ * auVar89._8_4_;
    auVar57._12_4_ = auVar41._12_4_ * auVar89._12_4_;
    auVar57._16_4_ = auVar89._16_4_ * 0.0;
    auVar57._20_4_ = auVar89._20_4_ * 0.0;
    auVar57._24_4_ = auVar89._24_4_ * 0.0;
    auVar57._28_4_ = auVar89._28_4_;
    auVar149._8_4_ = 0x7f800000;
    auVar149._0_8_ = 0x7f8000007f800000;
    auVar149._12_4_ = 0x7f800000;
    auVar149._16_4_ = 0x7f800000;
    auVar149._20_4_ = 0x7f800000;
    auVar149._24_4_ = 0x7f800000;
    auVar149._28_4_ = 0x7f800000;
    auVar170 = vblendvps_avx(auVar57,auVar149,auVar129);
    auVar106 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar129 = vpand_avx2(auVar120,auVar106);
    auVar129 = vpcmpeqd_avx2(auVar129,auVar109);
    auVar41 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar121._0_4_ = fVar17 + fVar172 * auVar123._0_4_;
    auVar121._4_4_ = fVar21 + fVar175 * auVar123._4_4_;
    auVar121._8_4_ = fVar25 + fVar176 * auVar123._8_4_;
    auVar121._12_4_ = fVar29 + fVar177 * auVar123._12_4_;
    auVar121._16_4_ = auVar123._16_4_ * 0.0 + 0.0;
    auVar121._20_4_ = auVar123._20_4_ * 0.0 + 0.0;
    auVar121._24_4_ = auVar123._24_4_ * 0.0 + 0.0;
    auVar121._28_4_ = 0;
    auVar109 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar129 = vcmpps_avx(auVar121,auVar109,6);
    auVar89 = vcmpps_avx(auVar121,auVar127,1);
    auVar129 = vandps_avx(auVar129,auVar89);
    auVar43 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar43 = vpand_avx(auVar88,auVar43);
    auVar129 = vpmovsxwd_avx2(auVar43);
    local_600 = vblendvps_avx(auVar149,auVar123,auVar129);
    auVar122._2_2_ = 0;
    auVar122._0_2_ = uVar2;
    auVar122._4_2_ = uVar2;
    auVar122._6_2_ = 0;
    auVar122._8_2_ = uVar2;
    auVar122._10_2_ = 0;
    auVar122._12_2_ = uVar2;
    auVar122._14_2_ = 0;
    auVar122._16_2_ = uVar2;
    auVar122._18_2_ = 0;
    auVar122._20_2_ = uVar2;
    auVar122._22_2_ = 0;
    auVar122._24_2_ = uVar2;
    auVar122._26_2_ = 0;
    auVar122._28_2_ = uVar2;
    auVar122._30_2_ = 0;
    auVar129 = vpand_avx2(auVar122,auVar106);
    auVar89 = vpcmpeqd_avx2(auVar129,auVar109);
    local_540._0_4_ = fVar17 + fVar172 * auVar170._0_4_;
    local_540._4_4_ = fVar21 + fVar175 * auVar170._4_4_;
    fStack_538 = fVar25 + fVar176 * auVar170._8_4_;
    fStack_534 = fVar29 + fVar177 * auVar170._12_4_;
    fStack_530 = auVar170._16_4_ * 0.0 + 0.0;
    fStack_52c = auVar170._20_4_ * 0.0 + 0.0;
    fStack_528 = auVar170._24_4_ * 0.0 + 0.0;
    register0x0000135c = auVar123._28_4_ + 0.0;
    auVar129 = vcmpps_avx(_local_540,auVar109,6);
    auVar123 = vcmpps_avx(_local_540,auVar127,1);
    auVar129 = vandps_avx(auVar123,auVar129);
    auVar43 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar43 = vpand_avx(auVar88,auVar43);
    auVar129 = vpmovsxwd_avx2(auVar43);
    local_4a0 = vblendvps_avx(auVar148,auVar170,auVar129);
    auVar43 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
    auVar129 = vrcpps_avx(ZEXT1632(auVar42));
    auVar42 = vfnmadd213ps_fma(auVar129,ZEXT1632(auVar42),auVar90);
    auVar40 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar129,auVar129);
    auVar58._4_4_ = fVar175 * (float)local_560._4_4_;
    auVar58._0_4_ = fVar172 * (float)local_560._0_4_;
    auVar58._8_4_ = fVar176 * fStack_558;
    auVar58._12_4_ = fVar177 * fStack_554;
    auVar58._16_4_ = fStack_550 * 0.0;
    auVar58._20_4_ = fStack_54c * 0.0;
    auVar58._24_4_ = fStack_548 * 0.0;
    auVar58._28_4_ = auVar129._28_4_;
    auVar134._0_4_ = fVar153 * fVar17;
    auVar134._4_4_ = fVar153 * fVar21;
    auVar134._8_4_ = fVar153 * fVar25;
    auVar134._12_4_ = fVar153 * fVar29;
    auVar134._16_4_ = fVar153 * 0.0;
    auVar134._20_4_ = fVar153 * 0.0;
    auVar134._24_4_ = fVar153 * 0.0;
    auVar134._28_4_ = 0;
    auVar129 = vsubps_avx(auVar58,auVar134);
    auVar59._4_4_ = fVar175 * (float)local_580._4_4_;
    auVar59._0_4_ = fVar172 * (float)local_580._0_4_;
    auVar59._8_4_ = fVar176 * fStack_578;
    auVar59._12_4_ = fVar177 * fStack_574;
    auVar59._16_4_ = fStack_570 * 0.0;
    auVar59._20_4_ = fStack_56c * 0.0;
    auVar59._24_4_ = fStack_568 * 0.0;
    auVar59._28_4_ = 0;
    auVar187._0_4_ = fVar17 * fVar185;
    auVar187._4_4_ = fVar21 * fVar185;
    auVar187._8_4_ = fVar25 * fVar185;
    auVar187._12_4_ = fVar29 * fVar185;
    auVar187._16_4_ = fVar185 * 0.0;
    auVar187._20_4_ = fVar185 * 0.0;
    auVar187._24_4_ = fVar185 * 0.0;
    auVar187._28_4_ = 0;
    auVar123 = vsubps_avx(auVar59,auVar187);
    auVar60._4_4_ = fVar175 * fVar19;
    auVar60._0_4_ = fVar172 * fVar194;
    auVar60._8_4_ = fVar176 * fVar23;
    auVar60._12_4_ = fVar177 * fVar27;
    auVar60._16_4_ = fVar31 * 0.0;
    auVar60._20_4_ = fVar34 * 0.0;
    auVar60._24_4_ = fVar37 * 0.0;
    auVar60._28_4_ = 0;
    auVar61._4_4_ = local_420 * fVar21;
    auVar61._0_4_ = local_420 * fVar17;
    auVar61._8_4_ = local_420 * fVar25;
    auVar61._12_4_ = local_420 * fVar29;
    auVar61._16_4_ = local_420 * 0.0;
    auVar61._20_4_ = local_420 * 0.0;
    auVar61._24_4_ = local_420 * 0.0;
    auVar61._28_4_ = 0x3f800000;
    auVar170 = vsubps_avx(auVar60,auVar61);
    auVar62._4_4_ = auVar170._4_4_ * auVar170._4_4_;
    auVar62._0_4_ = auVar170._0_4_ * auVar170._0_4_;
    auVar62._8_4_ = auVar170._8_4_ * auVar170._8_4_;
    auVar62._12_4_ = auVar170._12_4_ * auVar170._12_4_;
    auVar62._16_4_ = auVar170._16_4_ * auVar170._16_4_;
    auVar62._20_4_ = auVar170._20_4_ * auVar170._20_4_;
    auVar62._24_4_ = auVar170._24_4_ * auVar170._24_4_;
    auVar62._28_4_ = auVar170._28_4_;
    auVar42 = vfmadd231ps_fma(auVar62,auVar123,auVar123);
    auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar129,auVar129);
    auVar63._4_4_ = fVar161 * fVar137 * fVar137;
    auVar63._0_4_ = fVar154 * fVar131 * fVar131;
    auVar63._8_4_ = fVar162 * fVar139 * fVar139;
    auVar63._12_4_ = fVar163 * fVar141 * fVar141;
    auVar63._16_4_ = fVar142 * fVar142 * 0.0;
    auVar63._20_4_ = fVar143 * fVar143 * 0.0;
    auVar63._24_4_ = fVar144 * fVar144 * 0.0;
    auVar63._28_4_ = fVar183;
    auVar129 = vcmpps_avx(ZEXT1632(auVar42),auVar63,1);
    auVar42 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar42 = vpand_avx(auVar43,auVar42);
    auVar64._4_4_ = auVar40._4_4_ * -fVar21;
    auVar64._0_4_ = auVar40._0_4_ * -fVar17;
    auVar64._8_4_ = auVar40._8_4_ * -fVar25;
    auVar64._12_4_ = auVar40._12_4_ * -fVar29;
    auVar64._16_4_ = 0x80000000;
    auVar64._20_4_ = 0x80000000;
    auVar64._24_4_ = 0x80000000;
    auVar64._28_4_ = 0x80000000;
    auVar42 = vpand_avx(auVar88,auVar42);
    auVar129 = vpmovsxwd_avx2(auVar42);
    local_680 = vblendvps_avx(auVar149,auVar64,auVar129);
    local_660._0_4_ = auVar108._0_4_;
    local_660._4_4_ = auVar108._4_4_;
    fStack_658 = auVar108._8_4_;
    fStack_654 = auVar108._12_4_;
    fStack_650 = auVar108._16_4_;
    fStack_64c = auVar108._20_4_;
    fStack_648 = auVar108._24_4_;
    uStack_644 = auVar108._28_4_;
    auVar65._4_4_ = (float)local_660._4_4_ * fVar18;
    auVar65._0_4_ = (float)local_660._0_4_ * fVar193;
    auVar65._8_4_ = fStack_658 * fVar22;
    auVar65._12_4_ = fStack_654 * fVar26;
    auVar65._16_4_ = fStack_650 * fVar30;
    auVar65._20_4_ = fStack_64c * fVar33;
    auVar65._24_4_ = fStack_648 * fVar36;
    auVar65._28_4_ = 0x80000000;
    auVar42 = vfmadd231ps_fma(auVar65,auVar195,local_500);
    auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar100,local_4e0);
    auVar66._4_4_ = fVar175 * auVar100._4_4_;
    auVar66._0_4_ = fVar172 * auVar100._0_4_;
    auVar66._8_4_ = fVar176 * auVar100._8_4_;
    auVar66._12_4_ = fVar177 * auVar100._12_4_;
    auVar66._16_4_ = auVar100._16_4_ * 0.0;
    auVar66._20_4_ = auVar100._20_4_ * 0.0;
    auVar66._24_4_ = auVar100._24_4_ * 0.0;
    auVar66._28_4_ = auVar100._28_4_;
    auVar67._4_4_ = fVar175 * auVar195._4_4_;
    auVar67._0_4_ = fVar172 * auVar195._0_4_;
    auVar67._8_4_ = fVar176 * auVar195._8_4_;
    auVar67._12_4_ = fVar177 * auVar195._12_4_;
    auVar67._16_4_ = auVar195._16_4_ * 0.0;
    auVar67._20_4_ = auVar195._20_4_ * 0.0;
    auVar67._24_4_ = auVar195._24_4_ * 0.0;
    auVar67._28_4_ = auVar195._28_4_;
    auVar68._4_4_ = fVar175 * (float)local_660._4_4_;
    auVar68._0_4_ = fVar172 * (float)local_660._0_4_;
    auVar68._8_4_ = fVar176 * fStack_658;
    auVar68._12_4_ = fVar177 * fStack_654;
    auVar68._16_4_ = fStack_650 * 0.0;
    auVar68._20_4_ = fStack_64c * 0.0;
    auVar68._24_4_ = fStack_648 * 0.0;
    auVar68._28_4_ = uStack_644;
    fVar17 = auVar42._0_4_;
    fVar21 = auVar42._4_4_;
    auVar69._4_4_ = fVar153 * fVar21;
    auVar69._0_4_ = fVar153 * fVar17;
    fVar25 = auVar42._8_4_;
    auVar69._8_4_ = fVar153 * fVar25;
    fVar29 = auVar42._12_4_;
    auVar69._12_4_ = fVar153 * fVar29;
    auVar69._16_4_ = fVar153 * 0.0;
    auVar69._20_4_ = fVar153 * 0.0;
    uVar86 = local_4a0._28_4_;
    auVar69._24_4_ = fVar153 * 0.0;
    auVar69._28_4_ = uVar86;
    auVar129 = vsubps_avx(auVar66,auVar69);
    auVar70._4_4_ = fVar185 * fVar21;
    auVar70._0_4_ = fVar185 * fVar17;
    auVar70._8_4_ = fVar185 * fVar25;
    auVar70._12_4_ = fVar185 * fVar29;
    auVar70._16_4_ = fVar185 * 0.0;
    auVar70._20_4_ = fVar185 * 0.0;
    auVar70._24_4_ = fVar185 * 0.0;
    auVar70._28_4_ = uVar86;
    auVar123 = vsubps_avx(auVar67,auVar70);
    auVar71._4_4_ = local_420 * fVar21;
    auVar71._0_4_ = local_420 * fVar17;
    auVar71._8_4_ = local_420 * fVar25;
    auVar71._12_4_ = local_420 * fVar29;
    auVar71._16_4_ = local_420 * 0.0;
    auVar71._20_4_ = local_420 * 0.0;
    auVar71._24_4_ = local_420 * 0.0;
    auVar71._28_4_ = uVar86;
    auVar170 = vsubps_avx(auVar68,auVar71);
    auVar72._4_4_ = auVar170._4_4_ * auVar170._4_4_;
    auVar72._0_4_ = auVar170._0_4_ * auVar170._0_4_;
    auVar72._8_4_ = auVar170._8_4_ * auVar170._8_4_;
    auVar72._12_4_ = auVar170._12_4_ * auVar170._12_4_;
    auVar72._16_4_ = auVar170._16_4_ * auVar170._16_4_;
    auVar72._20_4_ = auVar170._20_4_ * auVar170._20_4_;
    auVar72._24_4_ = auVar170._24_4_ * auVar170._24_4_;
    auVar72._28_4_ = auVar170._28_4_;
    auVar42 = vfmadd231ps_fma(auVar72,auVar123,auVar123);
    auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar129,auVar129);
    local_620._0_4_ = auVar178._0_4_;
    local_620._4_4_ = auVar178._4_4_;
    fStack_618 = auVar178._8_4_;
    fStack_614 = auVar178._12_4_;
    fStack_610 = auVar178._16_4_;
    fStack_60c = auVar178._20_4_;
    fStack_608 = auVar178._24_4_;
    auVar178._4_4_ = fVar161 * (float)local_620._4_4_ * (float)local_620._4_4_;
    auVar178._0_4_ = fVar154 * (float)local_620._0_4_ * (float)local_620._0_4_;
    auVar178._8_4_ = fVar162 * fStack_618 * fStack_618;
    auVar178._12_4_ = fVar163 * fStack_614 * fStack_614;
    auVar178._16_4_ = fStack_610 * fStack_610 * 0.0;
    auVar178._20_4_ = fStack_60c * fStack_60c * 0.0;
    auVar178._24_4_ = fStack_608 * fStack_608 * 0.0;
    auVar178._28_4_ = auVar123._28_4_;
    uVar86 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar91._4_4_ = uVar86;
    auVar91._0_4_ = uVar86;
    auVar91._8_4_ = uVar86;
    auVar91._12_4_ = uVar86;
    auVar91._16_4_ = uVar86;
    auVar91._20_4_ = uVar86;
    auVar91._24_4_ = uVar86;
    auVar91._28_4_ = uVar86;
    auVar129 = vcmpps_avx(ZEXT1632(auVar42),auVar178,1);
    auVar42 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    auVar41 = vpand_avx(auVar42,auVar41);
    auVar103._0_4_ = auVar40._0_4_ * -fVar17;
    auVar103._4_4_ = auVar40._4_4_ * -fVar21;
    auVar103._8_4_ = auVar40._8_4_ * -fVar25;
    auVar103._12_4_ = auVar40._12_4_ * -fVar29;
    auVar103._16_4_ = 0x80000000;
    auVar103._20_4_ = 0x80000000;
    auVar103._24_4_ = 0x80000000;
    auVar103._28_4_ = 0;
    auVar41 = vpand_avx(auVar88,auVar41);
    auVar129 = vpmovsxwd_avx2(auVar41);
    auVar129 = vblendvps_avx(auVar149,auVar103,auVar129);
    auVar89 = vminps_avx(local_680,auVar129);
    auVar123 = vmaxps_avx(local_680,auVar129);
    auVar178 = vminps_avx(local_600,auVar89);
    auVar170 = vcmpps_avx(auVar178,auVar89,0);
    auVar129 = vcmpps_avx(auVar149,auVar123,0);
    auVar157._8_4_ = 0xff800000;
    auVar157._0_8_ = 0xff800000ff800000;
    auVar157._12_4_ = 0xff800000;
    auVar157._16_4_ = 0xff800000;
    auVar157._20_4_ = 0xff800000;
    auVar157._24_4_ = 0xff800000;
    auVar157._28_4_ = 0xff800000;
    auVar129 = vblendvps_avx(auVar123,auVar157,auVar129);
    auVar123 = vcmpps_avx(auVar149,auVar89,0);
    auVar123 = vblendvps_avx(auVar89,auVar157,auVar123);
    auVar129 = vblendvps_avx(auVar123,auVar129,auVar170);
    local_80 = vmaxps_avx(local_4a0,auVar129);
    auVar110._0_4_ = fVar130 + auVar178._0_4_;
    auVar110._4_4_ = fVar136 + auVar178._4_4_;
    auVar110._8_4_ = fVar138 + auVar178._8_4_;
    auVar110._12_4_ = fVar140 + auVar178._12_4_;
    auVar110._16_4_ = auVar178._16_4_ + 0.0;
    auVar110._20_4_ = auVar178._20_4_ + 0.0;
    auVar110._24_4_ = auVar178._24_4_ + 0.0;
    auVar110._28_4_ = fVar45 + auVar178._28_4_;
    uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
    local_620._4_4_ = uVar86;
    local_620._0_4_ = uVar86;
    fStack_618 = (float)uVar86;
    fStack_614 = (float)uVar86;
    fStack_610 = (float)uVar86;
    fStack_60c = (float)uVar86;
    fStack_608 = (float)uVar86;
    register0x0000135c = uVar86;
    auVar129 = vcmpps_avx(auVar91,auVar110,2);
    auVar123 = vcmpps_avx(auVar110,_local_620,2);
    auVar129 = vandps_avx(auVar129,auVar123);
    auVar123 = vcmpps_avx(auVar149,auVar178,4);
    auVar129 = vandps_avx(auVar129,auVar123);
    auVar41 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    local_5c0 = vpand_avx(auVar88,auVar41);
    local_640._0_4_ = fVar130 + local_80._0_4_;
    local_640._4_4_ = fVar136 + local_80._4_4_;
    local_640._8_4_ = fVar138 + local_80._8_4_;
    local_640._12_4_ = fVar140 + local_80._12_4_;
    local_640._16_4_ = local_80._16_4_ + 0.0;
    local_640._20_4_ = local_80._20_4_ + 0.0;
    local_640._24_4_ = local_80._24_4_ + 0.0;
    fStack_84 = local_80._28_4_;
    local_640._28_4_ = fVar45 + fStack_84;
    auVar129 = vcmpps_avx(auVar91,local_640,2);
    auVar123 = vcmpps_avx(local_640,_local_620,2);
    auVar129 = vandps_avx(auVar129,auVar123);
    auVar123 = vcmpps_avx(auVar157,local_80,4);
    auVar129 = vandps_avx(auVar129,auVar123);
    auVar41 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
    local_5d0 = vpand_avx(auVar88,auVar41);
    local_480 = vpor_avx(local_5c0,local_5d0);
    auVar129 = vpmovsxwd_avx2(local_480);
    if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0x7f,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar129 >> 0xbf,0) != '\0') ||
        (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar129[0x1f] < '\0') {
      auStack_5b0 = auVar100._16_16_;
      auVar129 = vpmovzxwd_avx2(local_5c0);
      auVar123 = vpslld_avx2(auVar129,0x1f);
      auVar129 = vblendvps_avx(local_80,auVar178,auVar123);
      auVar123 = vblendvps_avx(_local_540,auVar121,auVar123);
      auVar170 = vrcpps_avx(auVar127);
      auVar180._8_4_ = 0x3f800000;
      auVar180._0_8_ = 0x3f8000003f800000;
      auVar180._12_4_ = 0x3f800000;
      auVar180._16_4_ = 0x3f800000;
      auVar180._20_4_ = 0x3f800000;
      auVar180._24_4_ = 0x3f800000;
      auVar180._28_4_ = 0x3f800000;
      auVar41 = vfnmadd213ps_fma(auVar170,auVar127,auVar180);
      auVar43 = vfmadd132ps_fma(ZEXT1632(auVar41),auVar170,auVar170);
      fVar131 = fVar189 * fVar16 * fVar131;
      fVar137 = fVar190 * fVar20 * fVar137;
      fVar139 = fVar191 * fVar24 * fVar139;
      fVar141 = fVar192 * fVar28 * fVar141;
      fVar142 = fVar32 * 0.0 * fVar142;
      fVar143 = fVar35 * 0.0 * fVar143;
      fVar144 = fVar182 * 0.0 * fVar144;
      local_a0 = local_4e0._0_4_ * fVar131;
      fStack_9c = local_4e0._4_4_ * fVar137;
      fVar182 = local_4e0._8_4_;
      fVar183 = local_4e0._12_4_;
      fVar107 = local_4e0._16_4_;
      fVar113 = local_4e0._20_4_;
      fVar114 = local_4e0._24_4_;
      local_c0 = local_4e0._0_4_ * fVar87;
      fStack_bc = local_4e0._4_4_ * fVar94;
      auVar170 = vcmpps_avx(auVar129,local_600,0);
      auVar89 = vcmpps_avx(local_4a0,auVar129,0);
      auVar170 = vorps_avx(auVar170,auVar89);
      auVar41 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
      auVar42 = vpand_avx(auVar41,auVar88);
      auVar170 = vcmpps_avx(local_680,auVar129,0);
      auVar41 = vpackssdw_avx(auVar170._0_16_,auVar170._16_16_);
      auVar88 = vpand_avx(auVar41,auVar88);
      fVar189 = auVar129._0_4_;
      fVar191 = auVar129._4_4_;
      fVar16 = auVar129._8_4_;
      fVar20 = auVar129._12_4_;
      fVar24 = auVar129._16_4_;
      fVar28 = auVar129._20_4_;
      fVar32 = auVar129._24_4_;
      fStack_98 = fVar182 * fVar139;
      fStack_94 = fVar183 * fVar141;
      fStack_90 = fVar107 * fVar142;
      fStack_8c = fVar113 * fVar143;
      fStack_88 = fVar114 * fVar144;
      auVar150._0_4_ = local_a0 + fVar119 * (fVar153 * fVar189 + (float)local_560._0_4_);
      auVar150._4_4_ = fStack_9c + fVar124 * (fVar153 * fVar191 + (float)local_560._4_4_);
      auVar150._8_4_ = fVar182 * fVar139 + fVar125 * (fVar153 * fVar16 + fStack_558);
      auVar150._12_4_ = fVar183 * fVar141 + fVar126 * (fVar153 * fVar20 + fStack_554);
      auVar150._16_4_ = fVar107 * fVar142 + (fVar153 * fVar24 + fStack_550) * 0.0;
      auVar150._20_4_ = fVar113 * fVar143 + (fVar153 * fVar28 + fStack_54c) * 0.0;
      auVar150._24_4_ = fVar114 * fVar144 + (fVar153 * fVar32 + fStack_548) * 0.0;
      auVar150._28_4_ = fStack_84 + local_560._28_4_ + 0.0;
      fStack_b8 = fVar182 * fVar95;
      fStack_b4 = fVar183 * fVar96;
      fStack_b0 = fVar107 * fVar97;
      fStack_ac = fVar113 * fVar98;
      fStack_a8 = fVar114 * fVar99;
      fStack_a4 = local_420;
      fVar190 = auVar123._0_4_;
      fVar192 = auVar123._4_4_;
      auVar73._4_4_ = fStack_bc * fVar192;
      auVar73._0_4_ = local_c0 * fVar190;
      fVar17 = auVar123._8_4_;
      auVar73._8_4_ = fVar182 * fVar95 * fVar17;
      fVar21 = auVar123._12_4_;
      auVar73._12_4_ = fVar183 * fVar96 * fVar21;
      fVar25 = auVar123._16_4_;
      auVar73._16_4_ = fVar107 * fVar97 * fVar25;
      fVar29 = auVar123._20_4_;
      auVar73._20_4_ = fVar113 * fVar98 * fVar29;
      fVar35 = auVar123._24_4_;
      auVar73._24_4_ = fVar114 * fVar99 * fVar35;
      auVar73._28_4_ = fStack_84;
      auVar170 = vsubps_avx(auVar150,auVar73);
      local_100 = local_500._0_4_ * fVar131;
      fStack_fc = local_500._4_4_ * fVar137;
      fVar115 = local_500._8_4_;
      fVar116 = local_500._12_4_;
      fVar117 = local_500._16_4_;
      fVar118 = local_500._20_4_;
      fVar154 = local_500._24_4_;
      fStack_f8 = fVar115 * fVar139;
      fStack_f4 = fVar116 * fVar141;
      fStack_f0 = fVar117 * fVar142;
      fStack_ec = fVar118 * fVar143;
      fStack_e8 = fVar154 * fVar144;
      fStack_e4 = local_420;
      auVar158._0_4_ = local_100 + fVar119 * (fVar185 * fVar189 + (float)local_580._0_4_);
      auVar158._4_4_ = fStack_fc + fVar124 * (fVar185 * fVar191 + (float)local_580._4_4_);
      auVar158._8_4_ = fVar115 * fVar139 + fVar125 * (fVar185 * fVar16 + fStack_578);
      auVar158._12_4_ = fVar116 * fVar141 + fVar126 * (fVar185 * fVar20 + fStack_574);
      auVar158._16_4_ = fVar117 * fVar142 + (fVar185 * fVar24 + fStack_570) * 0.0;
      auVar158._20_4_ = fVar118 * fVar143 + (fVar185 * fVar28 + fStack_56c) * 0.0;
      auVar158._24_4_ = fVar154 * fVar144 + (fVar185 * fVar32 + fStack_568) * 0.0;
      auVar158._28_4_ = local_420 + fStack_84 + fStack_564;
      local_e0 = local_500._0_4_ * fVar87;
      fStack_dc = local_500._4_4_ * fVar94;
      fStack_d8 = fVar115 * fVar95;
      fStack_d4 = fVar116 * fVar96;
      fStack_d0 = fVar117 * fVar97;
      fStack_cc = fVar118 * fVar98;
      fStack_c8 = fVar154 * fVar99;
      fStack_c4 = local_420;
      auVar74._4_4_ = fStack_dc * fVar192;
      auVar74._0_4_ = local_e0 * fVar190;
      auVar74._8_4_ = fVar115 * fVar95 * fVar17;
      auVar74._12_4_ = fVar116 * fVar96 * fVar21;
      auVar74._16_4_ = fVar117 * fVar97 * fVar25;
      auVar74._20_4_ = fVar118 * fVar98 * fVar29;
      auVar74._24_4_ = fVar154 * fVar99 * fVar35;
      auVar74._28_4_ = fVar153;
      auVar89 = vsubps_avx(auVar158,auVar74);
      auVar178 = vpmovsxwd_avx2(auVar42);
      auVar100 = vpmovsxwd_avx2(auVar88);
      local_160._0_8_ = local_4e0._0_8_ ^ 0x8000000080000000;
      local_160._8_4_ = -fVar182;
      local_160._12_4_ = -fVar183;
      local_160._16_4_ = -fVar107;
      local_160._20_4_ = -fVar113;
      local_160._24_4_ = -fVar114;
      local_160._28_4_ = -fVar46;
      auVar123 = vblendvps_avx(local_4e0,local_160,auVar100);
      local_460 = vblendvps_avx(auVar123,auVar170,auVar178);
      auVar184 = ZEXT3264(local_520);
      local_440._4_4_ = fVar18 * fVar94;
      local_440._0_4_ = fVar193 * fVar87;
      fStack_438 = fVar22 * fVar95;
      fStack_434 = fVar26 * fVar96;
      fStack_430 = fVar30 * fVar97;
      fStack_42c = fVar33 * fVar98;
      fStack_428 = fVar36 * fVar99;
      unique0x100082be = 0;
      auVar152 = ZEXT3264(local_4c0);
      local_120 = fVar193 * fVar131;
      fStack_11c = fVar18 * fVar137;
      fStack_118 = fVar22 * fVar139;
      fStack_114 = fVar26 * fVar141;
      fStack_110 = fVar30 * fVar142;
      fStack_10c = fVar33 * fVar143;
      fStack_108 = fVar36 * fVar144;
      fStack_104 = local_160._28_4_;
      auVar104._0_4_ = fVar193 * fVar131 + fVar119 * (fVar194 + fVar189 * local_420);
      auVar104._4_4_ = fVar18 * fVar137 + fVar124 * (fVar19 + fVar191 * local_420);
      auVar104._8_4_ = fVar22 * fVar139 + fVar125 * (fVar23 + fVar16 * local_420);
      auVar104._12_4_ = fVar26 * fVar141 + fVar126 * (fVar27 + fVar20 * local_420);
      auVar104._16_4_ = fVar30 * fVar142 + (fVar31 + fVar24 * local_420) * 0.0;
      auVar104._20_4_ = fVar33 * fVar143 + (fVar34 + fVar28 * local_420) * 0.0;
      auVar104._24_4_ = fVar36 * fVar144 + (fVar37 + fVar32 * local_420) * 0.0;
      auVar104._28_4_ = local_160._28_4_ + fStack_464 + fVar46 + 0.0;
      auVar75._4_4_ = fVar192 * fVar18 * fVar94;
      auVar75._0_4_ = fVar190 * fVar193 * fVar87;
      auVar75._8_4_ = fVar17 * fVar22 * fVar95;
      auVar75._12_4_ = fVar21 * fVar26 * fVar96;
      auVar75._16_4_ = fVar25 * fVar30 * fVar97;
      auVar75._20_4_ = fVar29 * fVar33 * fVar98;
      auVar75._24_4_ = fVar35 * fVar36 * fVar99;
      auVar75._28_4_ = auVar123._28_4_;
      local_180._0_8_ = local_500._0_8_ ^ 0x8000000080000000;
      local_180._8_4_ = -fVar115;
      local_180._12_4_ = -fVar116;
      local_180._16_4_ = -fVar117;
      local_180._20_4_ = -fVar118;
      local_180._24_4_ = -fVar154;
      local_180._28_4_ = local_500._28_4_ ^ 0x80000000;
      auVar123 = vblendvps_avx(local_500,local_180,auVar100);
      auVar170 = vsubps_avx(auVar104,auVar75);
      local_380 = vblendvps_avx(auVar123,auVar89,auVar178);
      local_1a0._0_8_ = local_520._0_8_ ^ 0x8000000080000000;
      local_1a0._8_4_ = -fVar22;
      local_1a0._12_4_ = -fVar26;
      local_1a0._16_4_ = -fVar30;
      local_1a0._20_4_ = -fVar33;
      local_1a0._24_4_ = -fVar36;
      local_1a0._28_4_ = -fVar48;
      auVar123 = vblendvps_avx(local_520,local_1a0,auVar100);
      local_360 = vblendvps_avx(auVar123,auVar170,auVar178);
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar92._16_4_ = 0x3f800000;
      auVar92._20_4_ = 0x3f800000;
      auVar92._24_4_ = 0x3f800000;
      auVar92._28_4_ = 0x3f800000;
      local_140 = vandnps_avx(auVar100,auVar92);
      _local_660 = ZEXT1632(auVar43);
      auVar76._4_4_ = fVar192 * auVar43._4_4_;
      auVar76._0_4_ = fVar190 * auVar43._0_4_;
      auVar76._8_4_ = fVar17 * auVar43._8_4_;
      auVar76._12_4_ = fVar21 * auVar43._12_4_;
      auVar76._16_4_ = fVar25 * 0.0;
      auVar76._20_4_ = fVar29 * 0.0;
      auVar76._24_4_ = fVar35 * 0.0;
      auVar76._28_4_ = auVar100._28_4_;
      local_400 = vblendvps_avx(local_140,auVar76,auVar178);
      local_3c0._0_4_ = fVar189 + fVar130;
      local_3c0._4_4_ = fVar191 + fVar136;
      local_3c0._8_4_ = fVar16 + fVar138;
      local_3c0._12_4_ = fVar20 + fVar140;
      local_3c0._16_4_ = fVar24 + 0.0;
      local_3c0._20_4_ = fVar28 + 0.0;
      local_3c0._24_4_ = fVar32 + 0.0;
      local_3c0._28_4_ = auVar129._28_4_ + fVar45;
      auVar188 = ZEXT864(0) << 0x20;
      local_3e0 = ZEXT832(0) << 0x20;
      local_3a0 = local_460;
      auVar88 = vpsllw_avx(local_480,0xf);
      auVar88 = vpacksswb_avx(auVar88,auVar88);
      uVar85 = (ulong)(byte)(SUB161(auVar88 >> 7,0) & 1 | (SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar88 >> 0x37,0) & 1) << 6 | SUB161(auVar88 >> 0x3f,0) << 7);
      iVar81 = 1 << ((uint)k & 0x1f);
      auVar93._4_4_ = iVar81;
      auVar93._0_4_ = iVar81;
      auVar93._8_4_ = iVar81;
      auVar93._12_4_ = iVar81;
      auVar93._16_4_ = iVar81;
      auVar93._20_4_ = iVar81;
      auVar93._24_4_ = iVar81;
      auVar93._28_4_ = iVar81;
      auVar123 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
      auVar129 = vpand_avx2(auVar93,auVar123);
      local_5a0 = vpcmpeqd_avx2(auVar129,auVar123);
      auVar168 = ZEXT3264(_local_560);
      auVar171 = ZEXT3264(_local_580);
      auVar174 = ZEXT3264(local_4c0);
      auVar160 = ZEXT3264(local_4e0);
      auVar181 = ZEXT3264(local_500);
      auVar196 = ZEXT3264(local_600);
      auVar179 = ZEXT3264(local_640);
      local_6a8 = line;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      do {
        auVar129 = auVar160._0_32_;
        local_6d8.valid = (int *)local_6a0;
        auVar89 = auVar174._0_32_;
        auVar170 = auVar171._0_32_;
        auVar123 = auVar168._0_32_;
        fVar153 = auVar152._28_4_;
        auVar195 = auVar196._0_32_;
        auVar108 = auVar184._0_32_;
        auVar100 = auVar181._0_32_;
        auVar178 = auVar179._0_32_;
        uVar39 = 0;
        for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          uVar39 = uVar39 + 1;
        }
        uVar4 = local_2e0[uVar39];
        pGVar13 = (pSVar12->geometries).items[uVar4].ptr;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar84 = true, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0174d487;
          uVar83 = (ulong)(uint)((int)uVar39 * 4);
          local_260 = *(undefined4 *)(local_400 + uVar83);
          local_240 = *(undefined4 *)(local_3e0 + uVar83);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar83);
          local_6d8.context = context->user;
          local_220._4_4_ = *(undefined4 *)((long)&(local_6a8->primIDs).field_0 + uVar83);
          uVar86 = *(undefined4 *)(local_3a0 + uVar83);
          auVar128._4_4_ = uVar86;
          auVar128._0_4_ = uVar86;
          auVar128._8_4_ = uVar86;
          auVar128._12_4_ = uVar86;
          auVar128._16_4_ = uVar86;
          auVar128._20_4_ = uVar86;
          auVar128._24_4_ = uVar86;
          auVar128._28_4_ = uVar86;
          uVar1 = *(undefined4 *)(local_380 + uVar83);
          local_2a0._4_4_ = uVar1;
          local_2a0._0_4_ = uVar1;
          local_2a0._8_4_ = uVar1;
          local_2a0._12_4_ = uVar1;
          local_2a0._16_4_ = uVar1;
          local_2a0._20_4_ = uVar1;
          local_2a0._24_4_ = uVar1;
          local_2a0._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_360 + uVar83);
          auVar88._4_4_ = uVar1;
          auVar88._0_4_ = uVar1;
          auVar88._8_4_ = uVar1;
          auVar88._12_4_ = uVar1;
          local_280._16_4_ = uVar1;
          local_280._0_16_ = auVar88;
          local_280._20_4_ = uVar1;
          local_280._24_4_ = uVar1;
          local_280._28_4_ = uVar1;
          auVar152 = ZEXT3264(local_280);
          local_200._4_4_ = uVar4;
          local_200._0_4_ = uVar4;
          local_200._8_4_ = uVar4;
          local_200._12_4_ = uVar4;
          local_200._16_4_ = uVar4;
          local_200._20_4_ = uVar4;
          local_200._24_4_ = uVar4;
          local_200._28_4_ = uVar4;
          local_2c0[0] = (RTCHitN)(char)uVar86;
          local_2c0[1] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[2] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[3] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[4] = (RTCHitN)(char)uVar86;
          local_2c0[5] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[6] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[7] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[8] = (RTCHitN)(char)uVar86;
          local_2c0[9] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[10] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0xb] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0xc] = (RTCHitN)(char)uVar86;
          local_2c0[0xd] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0xe] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0xf] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x10] = (RTCHitN)(char)uVar86;
          local_2c0[0x11] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x12] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x13] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x14] = (RTCHitN)(char)uVar86;
          local_2c0[0x15] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x16] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x17] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x18] = (RTCHitN)(char)uVar86;
          local_2c0[0x19] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x1a] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x1b] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x1c] = (RTCHitN)(char)uVar86;
          local_2c0[0x1d] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x1e] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x1f] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          auVar129 = vpcmpeqd_avx2(auVar128,auVar128);
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          uStack_250 = local_260;
          uStack_24c = local_260;
          uStack_248 = local_260;
          uStack_244 = local_260;
          uStack_23c = local_240;
          uStack_238 = local_240;
          uStack_234 = local_240;
          uStack_230 = local_240;
          uStack_22c = local_240;
          uStack_228 = local_240;
          uStack_224 = local_240;
          local_220._0_4_ = local_220._4_4_;
          local_220._8_4_ = local_220._4_4_;
          local_220._12_4_ = local_220._4_4_;
          local_220._16_4_ = local_220._4_4_;
          local_220._20_4_ = local_220._4_4_;
          local_220._24_4_ = local_220._4_4_;
          local_220._28_4_ = local_220._4_4_;
          uStack_1dc = (local_6d8.context)->instID[0];
          local_1e0 = uStack_1dc;
          uStack_1d8 = uStack_1dc;
          uStack_1d4 = uStack_1dc;
          uStack_1d0 = uStack_1dc;
          uStack_1cc = uStack_1dc;
          uStack_1c8 = uStack_1dc;
          uStack_1c4 = uStack_1dc;
          uStack_1bc = (local_6d8.context)->instPrimID[0];
          local_1c0 = uStack_1bc;
          uStack_1b8 = uStack_1bc;
          uStack_1b4 = uStack_1bc;
          uStack_1b0 = uStack_1bc;
          uStack_1ac = uStack_1bc;
          uStack_1a8 = uStack_1bc;
          uStack_1a4 = uStack_1bc;
          local_6a0 = local_5a0;
          local_6d8.geometryUserPtr = pGVar13->userPtr;
          local_6d8.hit = local_2c0;
          local_6d8.N = 8;
          local_6d8.ray = (RTCRayN *)ray;
          if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar129 = ZEXT1632(auVar129._0_16_);
            auVar152 = ZEXT1664(auVar88);
            (*pGVar13->occlusionFilterN)(&local_6d8);
            auVar129 = vpcmpeqd_avx2(auVar129,auVar129);
            auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar179 = ZEXT3264(local_640);
            auVar196 = ZEXT3264(local_600);
            auVar184 = ZEXT3264(local_520);
            auVar181 = ZEXT3264(local_500);
            auVar160 = ZEXT3264(local_4e0);
            auVar174 = ZEXT3264(local_4c0);
            auVar171 = ZEXT3264(_local_580);
            auVar168 = ZEXT3264(_local_560);
          }
          auVar106 = vpcmpeqd_avx2(auVar188._0_32_,local_6a0);
          auVar123 = auVar129 & ~auVar106;
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar123 >> 0x7f,0) == '\0') &&
                (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar123 >> 0xbf,0) == '\0') &&
              (auVar123 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar123[0x1f]) {
            auVar106 = auVar106 ^ auVar129;
          }
          else {
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              auVar129 = ZEXT1632(auVar129._0_16_);
              auVar152 = ZEXT1664(auVar152._0_16_);
              (*p_Var15)(&local_6d8);
              auVar129 = vpcmpeqd_avx2(auVar129,auVar129);
              auVar188 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar179 = ZEXT3264(local_640);
              auVar196 = ZEXT3264(local_600);
              auVar184 = ZEXT3264(local_520);
              auVar181 = ZEXT3264(local_500);
              auVar160 = ZEXT3264(local_4e0);
              auVar174 = ZEXT3264(local_4c0);
              auVar171 = ZEXT3264(_local_580);
              auVar168 = ZEXT3264(_local_560);
            }
            auVar123 = vpcmpeqd_avx2(auVar188._0_32_,local_6a0);
            auVar106 = auVar123 ^ auVar129;
            auVar111._8_4_ = 0xff800000;
            auVar111._0_8_ = 0xff800000ff800000;
            auVar111._12_4_ = 0xff800000;
            auVar111._16_4_ = 0xff800000;
            auVar111._20_4_ = 0xff800000;
            auVar111._24_4_ = 0xff800000;
            auVar111._28_4_ = 0xff800000;
            auVar129 = vblendvps_avx(auVar111,*(undefined1 (*) [32])(local_6d8.ray + 0x100),auVar123
                                    );
            *(undefined1 (*) [32])(local_6d8.ray + 0x100) = auVar129;
          }
          auVar129 = auVar160._0_32_;
          auVar89 = auVar174._0_32_;
          auVar170 = auVar171._0_32_;
          auVar123 = auVar168._0_32_;
          fVar153 = auVar152._28_4_;
          auVar195 = auVar196._0_32_;
          auVar108 = auVar184._0_32_;
          auVar100 = auVar181._0_32_;
          auVar178 = auVar179._0_32_;
          if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0x7f,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0xbf,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar106[0x1f] < '\0') {
            _local_620 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
            bVar84 = true;
            goto LAB_0174d487;
          }
          *(int *)(ray + k * 4 + 0x100) = local_620._0_4_;
        }
        auVar129 = auVar160._0_32_;
        auVar89 = auVar174._0_32_;
        auVar170 = auVar171._0_32_;
        auVar123 = auVar168._0_32_;
        fVar153 = auVar152._28_4_;
        auVar195 = auVar196._0_32_;
        auVar108 = auVar184._0_32_;
        auVar100 = auVar181._0_32_;
        auVar178 = auVar179._0_32_;
        uVar85 = uVar85 ^ 1L << (uVar39 & 0x3f);
      } while (uVar85 != 0);
      bVar84 = false;
LAB_0174d487:
      auVar41 = vpand_avx(local_5d0,local_5c0);
      auVar105._4_4_ = local_620._0_4_;
      auVar105._0_4_ = local_620._0_4_;
      auVar105._8_4_ = local_620._0_4_;
      auVar105._12_4_ = local_620._0_4_;
      auVar105._16_4_ = local_620._0_4_;
      auVar105._20_4_ = local_620._0_4_;
      auVar105._24_4_ = local_620._0_4_;
      auVar105._28_4_ = local_620._0_4_;
      auVar106 = vcmpps_avx(auVar178,auVar105,2);
      auVar88 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
      auVar88 = vpand_avx(auVar88,auVar41);
      auVar106 = vpmovzxwd_avx2(auVar88);
      auVar106 = vpslld_avx2(auVar106,0x1f);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0x7f,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0xbf,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar106[0x1f]) {
        return bVar84;
      }
      auVar109 = vcmpps_avx(local_80,local_680,0);
      auVar106 = vblendvps_avx(auVar129,local_160,auVar109);
      auVar100 = vblendvps_avx(auVar100,local_180,auVar109);
      auVar108 = vblendvps_avx(auVar108,local_1a0,auVar109);
      auVar195 = vcmpps_avx(local_80,auVar195,0);
      auVar109 = vcmpps_avx(local_80,local_4a0,0);
      auVar195 = vorps_avx(auVar195,auVar109);
      fVar185 = local_80._0_4_;
      fVar189 = local_80._4_4_;
      fVar190 = local_80._8_4_;
      fVar191 = local_80._12_4_;
      fVar192 = local_80._16_4_;
      fVar193 = local_80._20_4_;
      fVar194 = local_80._24_4_;
      auVar135._0_4_ =
           (float)local_320._0_4_ * (auVar123._0_4_ + fVar185 * (float)local_340._0_4_) + local_a0;
      auVar135._4_4_ =
           (float)local_320._4_4_ * (auVar123._4_4_ + fVar189 * (float)local_340._4_4_) + fStack_9c;
      auVar135._8_4_ = fStack_318 * (auVar123._8_4_ + fVar190 * fStack_338) + fStack_98;
      auVar135._12_4_ = fStack_314 * (auVar123._12_4_ + fVar191 * fStack_334) + fStack_94;
      auVar135._16_4_ = fStack_310 * (auVar123._16_4_ + fVar192 * fStack_330) + fStack_90;
      auVar135._20_4_ = fStack_30c * (auVar123._20_4_ + fVar193 * fStack_32c) + fStack_8c;
      auVar135._24_4_ = fStack_308 * (auVar123._24_4_ + fVar194 * fStack_328) + fStack_88;
      auVar135._28_4_ = auVar123._28_4_ + auVar109._28_4_ + fStack_84;
      auVar151._0_4_ =
           (float)local_320._0_4_ * (auVar170._0_4_ + fVar185 * (float)local_300._0_4_) + local_100;
      auVar151._4_4_ =
           (float)local_320._4_4_ * (auVar170._4_4_ + fVar189 * (float)local_300._4_4_) + fStack_fc;
      auVar151._8_4_ = fStack_318 * (auVar170._8_4_ + fVar190 * fStack_2f8) + fStack_f8;
      auVar151._12_4_ = fStack_314 * (auVar170._12_4_ + fVar191 * fStack_2f4) + fStack_f4;
      auVar151._16_4_ = fStack_310 * (auVar170._16_4_ + fVar192 * fStack_2f0) + fStack_f0;
      auVar151._20_4_ = fStack_30c * (auVar170._20_4_ + fVar193 * fStack_2ec) + fStack_ec;
      auVar151._24_4_ = fStack_308 * (auVar170._24_4_ + fVar194 * fStack_2e8) + fStack_e8;
      auVar151._28_4_ = auVar170._28_4_ + fVar153 + fStack_e4;
      auVar159._0_4_ = (float)local_320._0_4_ * (auVar89._0_4_ + fVar185 * local_420) + local_120;
      auVar159._4_4_ = (float)local_320._4_4_ * (auVar89._4_4_ + fVar189 * fStack_41c) + fStack_11c;
      auVar159._8_4_ = fStack_318 * (auVar89._8_4_ + fVar190 * fStack_418) + fStack_118;
      auVar159._12_4_ = fStack_314 * (auVar89._12_4_ + fVar191 * fStack_414) + fStack_114;
      auVar159._16_4_ = fStack_310 * (auVar89._16_4_ + fVar192 * fStack_410) + fStack_110;
      auVar159._20_4_ = fStack_30c * (auVar89._20_4_ + fVar193 * fStack_40c) + fStack_10c;
      auVar159._24_4_ = fStack_308 * (auVar89._24_4_ + fVar194 * fStack_408) + fStack_108;
      auVar159._28_4_ = auVar89._28_4_ + auVar129._28_4_ + fStack_104;
      auVar77._4_4_ = (float)local_540._4_4_ * fStack_bc;
      auVar77._0_4_ = (float)local_540._0_4_ * local_c0;
      auVar77._8_4_ = fStack_538 * fStack_b8;
      auVar77._12_4_ = fStack_534 * fStack_b4;
      auVar77._16_4_ = fStack_530 * fStack_b0;
      auVar77._20_4_ = fStack_52c * fStack_ac;
      auVar77._24_4_ = fStack_528 * fStack_a8;
      auVar77._28_4_ = uStack_304;
      auVar129 = vsubps_avx(auVar135,auVar77);
      local_3a0 = vblendvps_avx(auVar106,auVar129,auVar195);
      auVar78._4_4_ = (float)local_540._4_4_ * fStack_dc;
      auVar78._0_4_ = (float)local_540._0_4_ * local_e0;
      auVar78._8_4_ = fStack_538 * fStack_d8;
      auVar78._12_4_ = fStack_534 * fStack_d4;
      auVar78._16_4_ = fStack_530 * fStack_d0;
      auVar78._20_4_ = fStack_52c * fStack_cc;
      auVar78._24_4_ = fStack_528 * fStack_c8;
      auVar78._28_4_ = auVar129._28_4_;
      auVar129 = vsubps_avx(auVar151,auVar78);
      local_380 = vblendvps_avx(auVar100,auVar129,auVar195);
      auVar79._4_4_ = (float)local_540._4_4_ * (float)local_440._4_4_;
      auVar79._0_4_ = (float)local_540._0_4_ * (float)local_440._0_4_;
      auVar79._8_4_ = fStack_538 * fStack_438;
      auVar79._12_4_ = fStack_534 * fStack_434;
      auVar79._16_4_ = fStack_530 * fStack_430;
      auVar79._20_4_ = fStack_52c * fStack_42c;
      auVar79._24_4_ = fStack_528 * fStack_428;
      auVar79._28_4_ = auVar129._28_4_;
      auVar129 = vsubps_avx(auVar159,auVar79);
      local_360 = vblendvps_avx(auVar108,auVar129,auVar195);
      auVar80._4_4_ = (float)local_540._4_4_ * (float)local_660._4_4_;
      auVar80._0_4_ = (float)local_540._0_4_ * (float)local_660._0_4_;
      auVar80._8_4_ = fStack_538 * fStack_658;
      auVar80._12_4_ = fStack_534 * fStack_654;
      auVar80._16_4_ = fStack_530 * fStack_650;
      auVar80._20_4_ = fStack_52c * fStack_64c;
      auVar80._24_4_ = fStack_528 * fStack_648;
      auVar80._28_4_ = auVar129._28_4_;
      local_400 = vblendvps_avx(local_140,auVar80,auVar195);
      auVar152 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_3e0 = ZEXT1232(ZEXT412(0)) << 0x20;
      local_3c0 = auVar178;
      pSVar12 = context->scene;
      auVar88 = vpsllw_avx(auVar88,0xf);
      auVar88 = vpacksswb_avx(auVar88,auVar88);
      uVar85 = (ulong)(byte)(SUB161(auVar88 >> 7,0) & 1 | (SUB161(auVar88 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar88 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar88 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar88 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar88 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar88 >> 0x37,0) & 1) << 6 | SUB161(auVar88 >> 0x3f,0) << 7);
      auVar129 = vpcmpeqd_avx2(auVar77,auVar77);
      auVar160 = ZEXT3264(auVar129);
      do {
        local_6d8.valid = (int *)local_6a0;
        uVar39 = 0;
        for (uVar83 = uVar85; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
          uVar39 = uVar39 + 1;
        }
        local_200._4_4_ = local_2e0[uVar39];
        pGVar13 = (pSVar12->geometries).items[(uint)local_200._4_4_].ptr;
        if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar82 = 1, pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0174d86f;
          uVar83 = (ulong)(uint)((int)uVar39 * 4);
          local_260 = *(undefined4 *)(local_400 + uVar83);
          local_240 = *(undefined4 *)(local_3e0 + uVar83);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar83);
          local_6d8.context = context->user;
          uVar86 = *(undefined4 *)((long)&(local_6a8->primIDs).field_0 + uVar83);
          local_220._4_4_ = uVar86;
          local_220._0_4_ = uVar86;
          local_220._8_4_ = uVar86;
          local_220._12_4_ = uVar86;
          local_220._16_4_ = uVar86;
          local_220._20_4_ = uVar86;
          local_220._24_4_ = uVar86;
          local_220._28_4_ = uVar86;
          uVar86 = *(undefined4 *)(local_3a0 + uVar83);
          uVar1 = *(undefined4 *)(local_380 + uVar83);
          local_2a0._4_4_ = uVar1;
          local_2a0._0_4_ = uVar1;
          local_2a0._8_4_ = uVar1;
          local_2a0._12_4_ = uVar1;
          local_2a0._16_4_ = uVar1;
          local_2a0._20_4_ = uVar1;
          local_2a0._24_4_ = uVar1;
          local_2a0._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_360 + uVar83);
          local_280._4_4_ = uVar1;
          local_280._0_4_ = uVar1;
          local_280._8_4_ = uVar1;
          local_280._12_4_ = uVar1;
          local_280._16_4_ = uVar1;
          local_280._20_4_ = uVar1;
          local_280._24_4_ = uVar1;
          local_280._28_4_ = uVar1;
          local_2c0[0] = (RTCHitN)(char)uVar86;
          local_2c0[1] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[2] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[3] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[4] = (RTCHitN)(char)uVar86;
          local_2c0[5] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[6] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[7] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[8] = (RTCHitN)(char)uVar86;
          local_2c0[9] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[10] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0xb] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0xc] = (RTCHitN)(char)uVar86;
          local_2c0[0xd] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0xe] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0xf] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x10] = (RTCHitN)(char)uVar86;
          local_2c0[0x11] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x12] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x13] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x14] = (RTCHitN)(char)uVar86;
          local_2c0[0x15] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x16] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x17] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x18] = (RTCHitN)(char)uVar86;
          local_2c0[0x19] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x1a] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x1b] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          local_2c0[0x1c] = (RTCHitN)(char)uVar86;
          local_2c0[0x1d] = (RTCHitN)(char)((uint)uVar86 >> 8);
          local_2c0[0x1e] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
          local_2c0[0x1f] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
          uStack_25c = local_260;
          uStack_258 = local_260;
          uStack_254 = local_260;
          uStack_250 = local_260;
          uStack_24c = local_260;
          uStack_248 = local_260;
          uStack_244 = local_260;
          uStack_23c = local_240;
          uStack_238 = local_240;
          uStack_234 = local_240;
          uStack_230 = local_240;
          uStack_22c = local_240;
          uStack_228 = local_240;
          uStack_224 = local_240;
          local_200._0_4_ = local_200._4_4_;
          local_200._8_4_ = local_200._4_4_;
          local_200._12_4_ = local_200._4_4_;
          local_200._16_4_ = local_200._4_4_;
          local_200._20_4_ = local_200._4_4_;
          local_200._24_4_ = local_200._4_4_;
          local_200._28_4_ = local_200._4_4_;
          uStack_1dc = (local_6d8.context)->instID[0];
          local_1e0 = uStack_1dc;
          uStack_1d8 = uStack_1dc;
          uStack_1d4 = uStack_1dc;
          uStack_1d0 = uStack_1dc;
          uStack_1cc = uStack_1dc;
          uStack_1c8 = uStack_1dc;
          uStack_1c4 = uStack_1dc;
          uStack_1bc = (local_6d8.context)->instPrimID[0];
          local_1c0 = uStack_1bc;
          uStack_1b8 = uStack_1bc;
          uStack_1b4 = uStack_1bc;
          uStack_1b0 = uStack_1bc;
          uStack_1ac = uStack_1bc;
          uStack_1a8 = uStack_1bc;
          uStack_1a4 = uStack_1bc;
          local_6a0 = local_5a0;
          local_6d8.geometryUserPtr = pGVar13->userPtr;
          local_6d8.hit = local_2c0;
          local_6d8.N = 8;
          local_6d8.ray = (RTCRayN *)ray;
          if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_680._0_8_ = ray;
            auVar129 = ZEXT1632(auVar160._0_16_);
            (*pGVar13->occlusionFilterN)(&local_6d8);
            auVar129 = vpcmpeqd_avx2(auVar129,auVar129);
            auVar160 = ZEXT3264(auVar129);
            auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
            ray = (RayK<8> *)local_680._0_8_;
          }
          auVar123 = vpcmpeqd_avx2(local_6a0,auVar152._0_32_);
          auVar129 = auVar160._0_32_ & ~auVar123;
          if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar129 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar129 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar129 >> 0x7f,0) == '\0') &&
                (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar129 >> 0xbf,0) == '\0') &&
              (auVar129 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar129[0x1f]) {
            auVar123 = auVar160._0_32_ ^ auVar123;
          }
          else {
            p_Var15 = context->args->filter;
            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
              auVar129 = ZEXT1632(auVar160._0_16_);
              (*p_Var15)(&local_6d8);
              auVar129 = vpcmpeqd_avx2(auVar129,auVar129);
              auVar160 = ZEXT3264(auVar129);
              auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar129 = vpcmpeqd_avx2(local_6a0,auVar152._0_32_);
            auVar123 = auVar160._0_32_ ^ auVar129;
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            auVar112._16_4_ = 0xff800000;
            auVar112._20_4_ = 0xff800000;
            auVar112._24_4_ = 0xff800000;
            auVar112._28_4_ = 0xff800000;
            auVar129 = vblendvps_avx(auVar112,*(undefined1 (*) [32])(local_6d8.ray + 0x100),auVar129
                                    );
            *(undefined1 (*) [32])(local_6d8.ray + 0x100) = auVar129;
          }
          if ((((((((auVar123 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar123 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar123 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar123 >> 0x7f,0) != '\0') ||
                (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar123 >> 0xbf,0) != '\0') ||
              (auVar123 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar123[0x1f] < '\0') {
            bVar82 = 1;
            goto LAB_0174d86f;
          }
          *(int *)(ray + k * 4 + 0x100) = local_620._0_4_;
        }
        uVar85 = uVar85 ^ 1L << (uVar39 & 0x3f);
        if (uVar85 == 0) {
          bVar82 = 0;
LAB_0174d86f:
          return (bool)(bVar84 | bVar82);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }